

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

int nni_dialer_create(nni_dialer **dp,nni_sock *s,char *url_str)

{
  int iVar1;
  nni_sp_tran *tran;
  nni_dialer *d;
  size_t sz;
  
  tran = nni_sp_tran_find(url_str);
  iVar1 = 9;
  if ((tran != (nni_sp_tran *)0x0) && (tran->tran_dialer != (nni_sp_dialer_ops *)0x0)) {
    sz = tran->tran_dialer->d_size + 0x8d0;
    d = (nni_dialer *)nni_zalloc(sz);
    if (d == (nni_dialer *)0x0) {
      iVar1 = 2;
    }
    else {
      iVar1 = nni_url_parse_inline(&d->d_url,url_str);
      if (iVar1 == 0) {
        iVar1 = nni_dialer_init(d,s,tran);
        if (iVar1 == 0) {
          *dp = d;
          iVar1 = 0;
        }
        else {
          nni_dialer_destroy(d);
        }
      }
      else {
        nni_free(d,sz);
      }
    }
  }
  return iVar1;
}

Assistant:

int
nni_dialer_create(nni_dialer **dp, nni_sock *s, const char *url_str)
{
	nni_sp_tran *tran;
	nni_dialer  *d;
	int          rv;
	size_t       sz;

	if (((tran = nni_sp_tran_find(url_str)) == NULL) ||
	    (tran->tran_dialer == NULL)) {
		return (NNG_ENOTSUP);
	}
	sz = NNI_ALIGN_UP(sizeof(*d)) + tran->tran_dialer->d_size;
	if ((d = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_parse_inline(&d->d_url, url_str)) != 0) {
		nni_free(d, sz);
		return (rv);
	}
	if ((rv = nni_dialer_init(d, s, tran)) != 0) {
		nni_dialer_destroy(d);
		return (rv);
	}
	*dp = d;
	return (0);
}